

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::removeVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  Data *this_00;
  AnchorVertex *vertex;
  AnchorVertex *second;
  AnchorVertex **ppAVar1;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar2;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_01;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.ptr = (AnchorVertex **)CONCAT44(local_58.d.ptr._4_4_,edge);
  this_00 = (this->m_vertexList).d;
  local_58.d.d = (Data *)item;
  if (this_00 != (Data *)0x0) {
    pNVar2 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)this_00,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_58);
    if ((pNVar2 != (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                    *)0x0) && (vertex = (pNVar2->value).first, vertex != (AnchorVertex *)0x0)) {
      this_01 = (this->graph).m_data + (2 < (int)edge);
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices(&local_58,this_01,vertex);
      ppAVar1 = local_58.d.ptr;
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        lVar4 = local_58.d.size << 3;
        lVar3 = 0;
        do {
          second = *(AnchorVertex **)((long)ppAVar1 + lVar3);
          Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
          removeEdge(this_01,vertex,second);
          removeInternalVertex(this,item,edge);
          removeInternalVertex(this,second->m_item,second->m_edge);
          lVar3 = lVar3 + 8;
        } while (lVar4 != lVar3);
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeVertex(QGraphicsLayoutItem *item, Qt::AnchorPoint edge)
{
    if (AnchorVertex *v = internalVertex(item, edge)) {
        Graph<AnchorVertex, AnchorData> &g = graph[edgeOrientation(edge)];
        const auto allVertices = g.adjacentVertices(v);
        for (auto *v2 : allVertices) {
            g.removeEdge(v, v2);
            removeInternalVertex(item, edge);
            removeInternalVertex(v2->m_item, v2->m_edge);
        }
    }
}